

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

void __thiscall
vox::VoxWriter::AddColor(VoxWriter *this,uint8_t *r,uint8_t *g,uint8_t *b,uint8_t *a,uint8_t *index)

{
  pointer piVar1;
  int local_44;
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_40 = b;
  local_38 = a;
  while( true ) {
    piVar1 = (this->colors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)*index <
        (ulong)((long)(this->colors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) break;
    local_44 = 0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->colors,&local_44);
  }
  piVar1[*index] = CONCAT13(*local_38,CONCAT12(*local_40,CONCAT11(*g,*r)));
  return;
}

Assistant:

void VoxWriter::AddColor(const uint8_t& r, const uint8_t& g, const uint8_t& b, const uint8_t& a, const uint8_t& index) {
    while (colors.size() <= index)
        colors.push_back(0);
    colors[index] = GetID(r, g, b, a);
}